

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int array_container_index_equalorlarger(array_container_t *arr,uint16_t x)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = binarySearch(arr->array,arr->cardinality,x);
  uVar2 = uVar1;
  if ((int)uVar1 < 0) {
    uVar2 = ~uVar1;
    if (arr->cardinality <= (int)~uVar1) {
      uVar2 = 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

inline int array_container_index_equalorlarger(const array_container_t *arr,
                                               uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        int32_t candidate = -idx - 1;
        if (candidate < arr->cardinality) return candidate;
        return -1;
    }
}